

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

uint32_t __thiscall
spirv_cross::CompilerMSL::ensure_correct_input_type
          (CompilerMSL *this,uint32_t type_id,uint32_t location,uint32_t num_components)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  uint32_t uVar3;
  SPIRType *pSVar4;
  runtime_error *prVar5;
  BaseType basetype;
  uint components;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  bool bVar8;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  pSVar4 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr + type_id);
  p_Var1 = &(this->inputs_by_location)._M_t._M_impl.super__Rb_tree_header;
  p_Var7 = (this->inputs_by_location)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var6 = &p_Var1->_M_header;
  for (; p_Var7 != (_Base_ptr)0x0; p_Var7 = (&p_Var7->_M_left)[bVar8]) {
    bVar8 = p_Var7[1]._M_color < location;
    if (!bVar8) {
      p_Var6 = p_Var7;
    }
  }
  p_Var7 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var6 != p_Var1) && (p_Var7 = p_Var6, location < p_Var6[1]._M_color)) {
    p_Var7 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var7 == p_Var1) {
    if (num_components <= pSVar4->vecsize) {
      return type_id;
    }
  }
  else {
    if (num_components == 0) {
      num_components = *(uint32_t *)&p_Var7[1]._M_left;
    }
    if (*(int *)&p_Var7[1]._M_parent == 2) {
      iVar2 = *(int *)&(pSVar4->super_IVariant).field_0xc;
      if (iVar2 != 8) {
        if (iVar2 == 7) goto switchD_0025a969_caseD_7;
        if (iVar2 != 6) {
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_40[0] = local_30;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_40,"Vertex attribute type mismatch between host and shader","")
          ;
          ::std::runtime_error::runtime_error(prVar5,(string *)local_40);
          *(undefined ***)prVar5 = &PTR__runtime_error_0035b0b8;
          __cxa_throw(prVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
    }
    else if (*(int *)&p_Var7[1]._M_parent == 1) {
      switch(*(undefined4 *)&(pSVar4->super_IVariant).field_0xc) {
      case 4:
      case 6:
      case 8:
        break;
      case 5:
        components = pSVar4->vecsize;
        if (pSVar4->vecsize < num_components) {
          components = num_components;
        }
        basetype = UShort;
        goto LAB_0025a9c5;
      case 7:
switchD_0025a969_caseD_7:
        components = pSVar4->vecsize;
        if (pSVar4->vecsize < num_components) {
          components = num_components;
        }
        basetype = UInt;
        goto LAB_0025a9c5;
      default:
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_40[0] = local_30;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_40,"Vertex attribute type mismatch between host and shader","");
        ::std::runtime_error::runtime_error(prVar5,(string *)local_40);
        *(undefined ***)prVar5 = &PTR__runtime_error_0035b0b8;
        __cxa_throw(prVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    if (num_components <= pSVar4->vecsize) {
      return type_id;
    }
  }
  basetype = Unknown;
  components = num_components;
LAB_0025a9c5:
  uVar3 = build_extended_vector_type(this,type_id,components,basetype);
  return uVar3;
}

Assistant:

uint32_t CompilerMSL::ensure_correct_input_type(uint32_t type_id, uint32_t location, uint32_t num_components)
{
	auto &type = get<SPIRType>(type_id);

	auto p_va = inputs_by_location.find(location);
	if (p_va == end(inputs_by_location))
	{
		if (num_components > type.vecsize)
			return build_extended_vector_type(type_id, num_components);
		else
			return type_id;
	}

	if (num_components == 0)
		num_components = p_va->second.vecsize;

	switch (p_va->second.format)
	{
	case MSL_SHADER_INPUT_FORMAT_UINT8:
	{
		switch (type.basetype)
		{
		case SPIRType::UByte:
		case SPIRType::UShort:
		case SPIRType::UInt:
			if (num_components > type.vecsize)
				return build_extended_vector_type(type_id, num_components);
			else
				return type_id;

		case SPIRType::Short:
			return build_extended_vector_type(type_id, num_components > type.vecsize ? num_components : type.vecsize,
			                                  SPIRType::UShort);
		case SPIRType::Int:
			return build_extended_vector_type(type_id, num_components > type.vecsize ? num_components : type.vecsize,
			                                  SPIRType::UInt);

		default:
			SPIRV_CROSS_THROW("Vertex attribute type mismatch between host and shader");
		}
	}

	case MSL_SHADER_INPUT_FORMAT_UINT16:
	{
		switch (type.basetype)
		{
		case SPIRType::UShort:
		case SPIRType::UInt:
			if (num_components > type.vecsize)
				return build_extended_vector_type(type_id, num_components);
			else
				return type_id;

		case SPIRType::Int:
			return build_extended_vector_type(type_id, num_components > type.vecsize ? num_components : type.vecsize,
			                                  SPIRType::UInt);

		default:
			SPIRV_CROSS_THROW("Vertex attribute type mismatch between host and shader");
		}
	}

	default:
		if (num_components > type.vecsize)
			type_id = build_extended_vector_type(type_id, num_components);
		break;
	}

	return type_id;
}